

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

ON_UUID * __thiscall ON_UuidList::SearchHelper(ON_UuidList *this,ON_UUID *uuid)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ON_UUID *pOVar4;
  ON_UUID *b;
  long lVar5;
  
  uVar2 = this->m_sorted_count;
  if ((8 < (int)((this->super_ON_SimpleArray<ON_UUID_struct>).m_count - uVar2)) ||
     (0 < this->m_removed_count)) {
    SortHelper(this);
    uVar2 = this->m_sorted_count;
  }
  if (0 < (int)uVar2) {
    pOVar4 = (ON_UUID *)
             bsearch(uuid,(this->super_ON_SimpleArray<ON_UUID_struct>).m_a,(ulong)uVar2,0x10,
                     CompareUuid);
    if (pOVar4 != (ON_UUID *)0x0) {
      return pOVar4;
    }
    uVar2 = this->m_sorted_count;
  }
  iVar1 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_count;
  lVar5 = (long)(int)uVar2 + -1;
  pOVar4 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_a + (int)uVar2;
  do {
    b = pOVar4;
    lVar5 = lVar5 + 1;
    if (iVar1 <= lVar5) {
      return (ON_UUID *)0x0;
    }
    iVar3 = CompareUuid(uuid,b);
    pOVar4 = b + 1;
  } while (iVar3 != 0);
  return b;
}

Assistant:

ON_UUID* ON_UuidList::SearchHelper(const ON_UUID* uuid) const
{
  if ( m_count - m_sorted_count > 8 || m_removed_count > 0 )
  {
    // time to resort the array so that the speedy
    // bsearch() can be used to find uuids
    const_cast<ON_UuidList*>(this)->SortHelper();
  }

  ON_UUID* p = (m_sorted_count > 0 )
             ? (ON_UUID*)bsearch( uuid, m_a, m_sorted_count, sizeof(m_a[0]), 
                                  (int(*)(const void*,const void*))ON_UuidList::CompareUuid ) 
             : 0;

  if (0 == p)
  {
    // do a slow search on the last m_count-m_sort_count elements
    // in the array.
    int i;
    for ( i = m_sorted_count; i < m_count; i++ )
    {
      if ( 0 == ON_UuidList::CompareUuid(uuid,m_a+i) )
      {
        p = m_a+i;
        break;
      }
    }
  }

  return p;
}